

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STTx.cpp
# Opt level: O0

string * __thiscall jbcoin::STTx::getFullText_abi_cxx11_(string *__return_storage_ptr__,STTx *this)

{
  base_uint<256UL,_void> *a;
  string local_90;
  uint256 local_70;
  string local_50;
  allocator local_1a;
  undefined1 local_19;
  STTx *local_18;
  STTx *this_local;
  string *ret;
  
  local_19 = 0;
  local_18 = this;
  this_local = (STTx *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,"\"",&local_1a);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a);
  getTransactionID(&local_70,this);
  to_string<256ul,void>(&local_50,(jbcoin *)&local_70,a);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\" = {");
  STObject::getFullText_abi_cxx11_(&local_90,&this->super_STObject);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"}");
  return __return_storage_ptr__;
}

Assistant:

std::string
STTx::getFullText () const
{
    std::string ret = "\"";
    ret += to_string (getTransactionID ());
    ret += "\" = {";
    ret += STObject::getFullText ();
    ret += "}";
    return ret;
}